

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalTersePrinter<const_char32_t_*>::Print(char32_t *str,ostream *os)

{
  allocator<char32_t> local_31;
  u32string local_30 [32];
  
  if (str != (char32_t *)0x0) {
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>(local_30,str,&local_31);
    testing::internal::PrintU32StringTo(local_30,os);
    std::__cxx11::u32string::~u32string(local_30);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

static void Print(const char32_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::u32string(str), os);
    }
  }